

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall
Catch::TestCaseFilter::TestCaseFilter(TestCaseFilter *this,string *testSpec,DoWhat matchBehaviour)

{
  pointer pcVar1;
  long *plVar2;
  int iVar3;
  DoWhat DVar4;
  char *pcVar5;
  bool bVar6;
  long *local_68;
  size_t local_60;
  long local_58 [2];
  long *local_48;
  ulong local_40;
  long local_38 [2];
  
  (this->m_stringToMatch)._M_dataplus._M_p = (pointer)&(this->m_stringToMatch).field_2;
  pcVar1 = (testSpec->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)this,pcVar1,pcVar1 + testSpec->_M_string_length);
  this->m_filterType = matchBehaviour;
  this->m_wildcardPosition = NoWildcard;
  if (matchBehaviour != AutoDetectBehaviour) goto LAB_00132713;
  local_48 = local_38;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"exclude:","");
  if ((this->m_stringToMatch)._M_string_length < local_40) {
    bVar6 = false;
  }
  else {
    std::__cxx11::string::substr((ulong)&local_68,(ulong)this);
    plVar2 = local_68;
    if (local_60 == local_40) {
      if (local_60 == 0) {
        bVar6 = true;
      }
      else {
        iVar3 = bcmp(local_68,local_48,local_60);
        bVar6 = iVar3 == 0;
      }
    }
    else {
      bVar6 = false;
    }
    if (plVar2 != local_58) {
      operator_delete(plVar2,local_58[0] + 1);
    }
  }
  if (local_48 != local_38) {
    operator_delete(local_48,local_38[0] + 1);
  }
  if (bVar6) {
    std::__cxx11::string::substr((ulong)&local_68,(ulong)this);
LAB_001326e3:
    std::__cxx11::string::operator=((string *)this,(string *)&local_68);
    if (local_68 != local_58) {
      operator_delete(local_68,local_58[0] + 1);
    }
    DVar4 = ExcludeTests;
  }
  else {
    local_48 = local_38;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"~","");
    if ((this->m_stringToMatch)._M_string_length < local_40) {
      bVar6 = false;
    }
    else {
      std::__cxx11::string::substr((ulong)&local_68,(ulong)this);
      plVar2 = local_68;
      if (local_60 == local_40) {
        if (local_60 == 0) {
          bVar6 = true;
        }
        else {
          iVar3 = bcmp(local_68,local_48,local_60);
          bVar6 = iVar3 == 0;
        }
      }
      else {
        bVar6 = false;
      }
      if (plVar2 != local_58) {
        operator_delete(plVar2,local_58[0] + 1);
      }
    }
    if (local_48 != local_38) {
      operator_delete(local_48,local_38[0] + 1);
    }
    DVar4 = IncludeTests;
    if (bVar6) {
      std::__cxx11::string::substr((ulong)&local_68,(ulong)this);
      goto LAB_001326e3;
    }
  }
  this->m_filterType = DVar4;
LAB_00132713:
  pcVar5 = (this->m_stringToMatch)._M_dataplus._M_p;
  if (*pcVar5 == '*') {
    std::__cxx11::string::substr((ulong)&local_68,(ulong)this);
    std::__cxx11::string::operator=((string *)this,(string *)&local_68);
    if (local_68 != local_58) {
      operator_delete(local_68,local_58[0] + 1);
    }
    *(undefined1 *)&this->m_wildcardPosition = (char)this->m_wildcardPosition | WildcardAtStart;
    pcVar5 = (this->m_stringToMatch)._M_dataplus._M_p;
  }
  if (pcVar5[(this->m_stringToMatch)._M_string_length - 1] == '*') {
    std::__cxx11::string::substr((ulong)&local_68,(ulong)this);
    std::__cxx11::string::operator=((string *)this,(string *)&local_68);
    if (local_68 != local_58) {
      operator_delete(local_68,local_58[0] + 1);
    }
    *(undefined1 *)&this->m_wildcardPosition = (char)this->m_wildcardPosition | WildcardAtEnd;
  }
  return;
}

Assistant:

TestCaseFilter( const std::string& testSpec, IfFilterMatches::DoWhat matchBehaviour = IfFilterMatches::AutoDetectBehaviour )
        :   m_stringToMatch( testSpec ),
            m_filterType( matchBehaviour ),
            m_wildcardPosition( NoWildcard )
        {
            if( m_filterType == IfFilterMatches::AutoDetectBehaviour ) {
                if( startsWith( m_stringToMatch, "exclude:" ) ) {
                    m_stringToMatch = m_stringToMatch.substr( 8 );
                    m_filterType = IfFilterMatches::ExcludeTests;
                }
                else if( startsWith( m_stringToMatch, "~" ) ) {
                    m_stringToMatch = m_stringToMatch.substr( 1 );
                    m_filterType = IfFilterMatches::ExcludeTests;
                }
                else {
                    m_filterType = IfFilterMatches::IncludeTests;
                }
            }

            if( m_stringToMatch[0] == '*' ) {
                m_stringToMatch = m_stringToMatch.substr( 1 );
                m_wildcardPosition = (WildcardPosition)( m_wildcardPosition | WildcardAtStart );
            }
            if( m_stringToMatch[m_stringToMatch.size()-1] == '*' ) {
                m_stringToMatch = m_stringToMatch.substr( 0, m_stringToMatch.size()-1 );
                m_wildcardPosition = (WildcardPosition)( m_wildcardPosition | WildcardAtEnd );
            }
        }